

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O2

void __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solve3right4update
          (SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *x,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y2,SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *b,
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *rhs,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *rhs2)

{
  uint uVar1;
  int iVar2;
  int *ridx;
  int *piVar3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *rhs2_00;
  int *piVar4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar7;
  pointer pnVar8;
  pointer pnVar9;
  pointer pnVar10;
  int *piVar11;
  pointer pnVar12;
  Real val;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps2_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps3;
  undefined1 auVar13 [56];
  int iVar14;
  undefined4 in_stack_fffffffffffffd64;
  undefined8 in_stack_fffffffffffffd88;
  undefined4 uVar15;
  undefined4 uStack_254;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  int f;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_1b8;
  uint local_1a8 [2];
  uint auStack_1a0 [2];
  uint local_198 [2];
  uint auStack_190 [4];
  int local_180;
  undefined1 local_17c;
  fpclass_type local_178;
  int32_t local_174;
  uint local_168 [2];
  uint auStack_160 [2];
  uint local_158 [2];
  uint auStack_150 [4];
  int local_140;
  undefined1 local_13c;
  fpclass_type local_138;
  int32_t local_134;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  uint local_e8 [2];
  uint auStack_e0 [2];
  uint local_d8 [2];
  uint auStack_d0 [4];
  int local_c0;
  undefined1 local_bc;
  fpclass_type local_b8;
  int32_t local_b4;
  uint local_a8 [2];
  uint auStack_a0 [2];
  uint local_98 [2];
  uint auStack_90 [4];
  int local_80;
  undefined1 local_7c;
  fpclass_type local_78;
  int32_t local_74;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  uVar15 = (undefined4)((ulong)in_stack_fffffffffffffd88 >> 0x20);
  uStack_254 = (undefined4)((ulong)b >> 0x20);
  (*this->solveTime->_vptr_Timer[3])();
  ridx = (this->ssvec).super_IdxSet.idx;
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  iVar14 = (rhs->super_IdxSet).num;
  rhs->setupStatus = false;
  piVar3 = (rhs->super_IdxSet).idx;
  uVar1 = (rhs2->super_IdxSet).num;
  rhs2->setupStatus = false;
  rhs2_00 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)(rhs2->super_IdxSet).idx;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1b8,
             &(this->
              super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  val = Tolerances::epsilon(local_1b8._M_ptr);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&epsilon.m_backend,val,(type *)0x0);
  this_00 = &this->
             super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b8._M_refcount);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(x);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(y);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(y2);
  this->usetup = true;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::operator=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
               *)&this->ssvec,b);
  if ((this->
      super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).l.updateType == 0) {
    iVar2 = (this->ssvec).super_IdxSet.num;
    local_68.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
    local_68.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
    local_68.m_backend.data._M_elems[6] = epsilon.m_backend.data._M_elems[6];
    local_68.m_backend.data._M_elems[7] = epsilon.m_backend.data._M_elems[7];
    local_68.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
    local_68.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
    local_68.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
    local_68.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
    local_68.m_backend.exp = epsilon.m_backend.exp;
    local_68.m_backend.neg = epsilon.m_backend.neg;
    local_68.m_backend.fpclass = epsilon.m_backend.fpclass;
    local_68.m_backend.prec_elem = epsilon.m_backend.prec_elem;
    piVar4 = (x->super_IdxSet).idx;
    pnVar5 = (x->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    x->setupStatus = false;
    pnVar6 = (this->ssvec).
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar7 = (y->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_98[0] = epsilon.m_backend.data._M_elems[4];
    local_98[1] = epsilon.m_backend.data._M_elems[5];
    auStack_90[0] = epsilon.m_backend.data._M_elems[6];
    auStack_90[1] = epsilon.m_backend.data._M_elems[7];
    local_a8[0] = epsilon.m_backend.data._M_elems[0];
    local_a8[1] = epsilon.m_backend.data._M_elems[1];
    auStack_a0[0] = epsilon.m_backend.data._M_elems[2];
    auStack_a0[1] = epsilon.m_backend.data._M_elems[3];
    local_80 = epsilon.m_backend.exp;
    local_7c = epsilon.m_backend.neg;
    local_78 = epsilon.m_backend.fpclass;
    local_74 = epsilon.m_backend.prec_elem;
    rhs->setupStatus = false;
    pnVar8 = (rhs->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar9 = (y2->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_d8[0] = epsilon.m_backend.data._M_elems[4];
    local_d8[1] = epsilon.m_backend.data._M_elems[5];
    auStack_d0[0] = epsilon.m_backend.data._M_elems[6];
    auStack_d0[1] = epsilon.m_backend.data._M_elems[7];
    local_e8[0] = epsilon.m_backend.data._M_elems[0];
    local_e8[1] = epsilon.m_backend.data._M_elems[1];
    auStack_e0[0] = epsilon.m_backend.data._M_elems[2];
    auStack_e0[1] = epsilon.m_backend.data._M_elems[3];
    local_c0 = epsilon.m_backend.exp;
    local_bc = epsilon.m_backend.neg;
    local_b8 = epsilon.m_backend.fpclass;
    local_b4 = epsilon.m_backend.prec_elem;
    rhs2->setupStatus = false;
    eps2_00.m_backend.data._M_elems._8_8_ = pnVar8;
    eps2_00.m_backend.data._M_elems._0_8_ = local_a8;
    eps2_00.m_backend.data._M_elems._16_8_ = piVar3;
    eps2_00.m_backend.data._M_elems[6] = iVar14;
    eps2_00.m_backend.data._M_elems[7] = in_stack_fffffffffffffd64;
    eps2_00.m_backend.data._M_elems._32_8_ = pnVar9;
    eps2_00.m_backend._40_8_ = local_e8;
    eps2_00.m_backend._48_8_ =
         (rhs2->
         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    auVar13._4_4_ = uStack_254;
    auVar13._0_4_ = iVar2;
    auVar13._8_8_ = pnVar5;
    auVar13._16_8_ = piVar4;
    auVar13._24_8_ = y2;
    auVar13._32_4_ = epsilon.m_backend.data._M_elems[0];
    auVar13._36_4_ = epsilon.m_backend.data._M_elems[1];
    auVar13._40_4_ = epsilon.m_backend.data._M_elems[2];
    auVar13._44_4_ = epsilon.m_backend.data._M_elems[3];
    auVar13._48_8_ = 0;
    iVar14 = CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::vSolveRight4update3
                       (this_00,&local_68,pnVar5,piVar4,pnVar6,ridx,iVar2,pnVar7,eps2_00,rhs2_00,
                        (int *)CONCAT44(uVar15,uVar1),0,
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)0x0,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                )(auVar13 << 0x40),
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)epsilon.m_backend.data._M_elems._16_8_,
                        (int *)epsilon.m_backend.data._M_elems._24_8_,
                        epsilon.m_backend.data._M_elems[8],
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)CONCAT44(epsilon.m_backend._44_4_,epsilon.m_backend.exp),
                        (int *)CONCAT44(epsilon.m_backend.prec_elem,epsilon.m_backend.fpclass),
                        (int *)this_00);
    (x->super_IdxSet).num = iVar14;
    x->setupStatus = false;
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::
    setup_and_assign<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)&this->eta,x);
  }
  else {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clear(&this->forest);
    iVar2 = (this->ssvec).super_IdxSet.num;
    local_128.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
    local_128.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
    local_128.m_backend.data._M_elems[6] = epsilon.m_backend.data._M_elems[6];
    local_128.m_backend.data._M_elems[7] = epsilon.m_backend.data._M_elems[7];
    local_128.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
    local_128.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
    local_128.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
    local_128.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
    local_128.m_backend.exp = epsilon.m_backend.exp;
    local_128.m_backend.neg = epsilon.m_backend.neg;
    local_128.m_backend.fpclass = epsilon.m_backend.fpclass;
    local_128.m_backend.prec_elem = epsilon.m_backend.prec_elem;
    piVar4 = (x->super_IdxSet).idx;
    pnVar5 = (x->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    x->setupStatus = false;
    pnVar6 = (this->ssvec).
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar7 = (y->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_158[0] = epsilon.m_backend.data._M_elems[4];
    local_158[1] = epsilon.m_backend.data._M_elems[5];
    auStack_150[0] = epsilon.m_backend.data._M_elems[6];
    auStack_150[1] = epsilon.m_backend.data._M_elems[7];
    local_168[0] = epsilon.m_backend.data._M_elems[0];
    local_168[1] = epsilon.m_backend.data._M_elems[1];
    auStack_160[0] = epsilon.m_backend.data._M_elems[2];
    auStack_160[1] = epsilon.m_backend.data._M_elems[3];
    local_140 = epsilon.m_backend.exp;
    local_13c = epsilon.m_backend.neg;
    local_138 = epsilon.m_backend.fpclass;
    local_134 = epsilon.m_backend.prec_elem;
    rhs->setupStatus = false;
    pnVar8 = (rhs->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar9 = (y2->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_198[0] = epsilon.m_backend.data._M_elems[4];
    local_198[1] = epsilon.m_backend.data._M_elems[5];
    auStack_190[0] = epsilon.m_backend.data._M_elems[6];
    auStack_190[1] = epsilon.m_backend.data._M_elems[7];
    local_1a8[0] = epsilon.m_backend.data._M_elems[0];
    local_1a8[1] = epsilon.m_backend.data._M_elems[1];
    auStack_1a0[0] = epsilon.m_backend.data._M_elems[2];
    auStack_1a0[1] = epsilon.m_backend.data._M_elems[3];
    local_180 = epsilon.m_backend.exp;
    local_17c = epsilon.m_backend.neg;
    local_178 = epsilon.m_backend.fpclass;
    local_174 = epsilon.m_backend.prec_elem;
    rhs2->setupStatus = false;
    pnVar10 = (rhs2->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    piVar11 = (this->forest).super_IdxSet.idx;
    pnVar12 = (this->forest).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    (this->forest).setupStatus = false;
    eps2.m_backend.data._M_elems._8_8_ = pnVar8;
    eps2.m_backend.data._M_elems._0_8_ = local_168;
    eps2.m_backend.data._M_elems._16_8_ = piVar3;
    eps2.m_backend.data._M_elems[6] = iVar14;
    eps2.m_backend.data._M_elems[7] = 0;
    eps2.m_backend.data._M_elems._32_8_ = pnVar9;
    eps2.m_backend._40_8_ = local_1a8;
    eps2.m_backend._48_8_ = pnVar10;
    eps3.m_backend.data._M_elems[2] = iVar2;
    eps3.m_backend.data._M_elems._0_8_ = piVar11;
    eps3.m_backend.data._M_elems[3] = 0;
    eps3.m_backend.data._M_elems._16_8_ = pnVar8;
    eps3.m_backend.data._M_elems._24_8_ = pnVar7;
    eps3.m_backend.data._M_elems._32_8_ = y2;
    eps3.m_backend._40_8_ = epsilon.m_backend.data._M_elems._0_8_;
    eps3.m_backend.fpclass = epsilon.m_backend.data._M_elems[2];
    eps3.m_backend.prec_elem = epsilon.m_backend.data._M_elems[3];
    iVar14 = CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::vSolveRight4update3
                       (this_00,&local_128,pnVar5,piVar4,pnVar6,ridx,iVar2,pnVar7,eps2,rhs2_00,
                        (int *)(ulong)uVar1,(int)pnVar12,
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&f,eps3,
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)epsilon.m_backend.data._M_elems._16_8_,
                        (int *)epsilon.m_backend.data._M_elems._24_8_,
                        epsilon.m_backend.data._M_elems[8],
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)CONCAT44(epsilon.m_backend._44_4_,epsilon.m_backend.exp),
                        (int *)CONCAT44(epsilon.m_backend.prec_elem,epsilon.m_backend.fpclass),
                        (int *)this_00);
    (x->super_IdxSet).num = iVar14;
    x->setupStatus = true;
    (this->forest).super_IdxSet.num = f;
    (this->forest).setupStatus = true;
  }
  rhs->setupStatus = true;
  rhs2->setupStatus = true;
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  this->solveCount = this->solveCount + 3;
  (*this->solveTime->_vptr_Timer[4])();
  return;
}

Assistant:

void SLUFactor<R>::solve3right4update(
   SSVectorBase<R>&       x,
   VectorBase<R>&        y,
   VectorBase<R>&        y2,
   const SVectorBase<R>& b,
   SSVectorBase<R>&       rhs,
   SSVectorBase<R>&       rhs2)
{

   solveTime->start();

   int  m;
   int  n;
   int  f;
   int* sidx = ssvec.altIndexMem();
   ssvec.setSize(0);
   ssvec.forceSetup();
   int  rsize = rhs.size();
   int* ridx = rhs.altIndexMem();
   int  rsize2 = rhs2.size();
   int* ridx2 = rhs2.altIndexMem();
   R epsilon = this->tolerances()->epsilon();

   x.clear();
   y.clear();
   y2.clear();
   usetup = true;
   ssvec = b;

   if(this->l.updateType == ETA)
   {
      n = ssvec.size();
      m = this->vSolveRight4update3(epsilon,
                                    x.altValues(), x.altIndexMem(), ssvec.get_ptr(), sidx, n,
                                    y.get_ptr(), epsilon, rhs.altValues(), ridx, rsize,
                                    y2.get_ptr(), epsilon, rhs2.altValues(), ridx2, rsize2,
                                    nullptr, nullptr, nullptr);
      x.setSize(m);
      //      x.forceSetup();
      x.unSetup();
      eta.setup_and_assign(x);
   }
   else
   {
      forest.clear();
      n = ssvec.size();
      m = this->vSolveRight4update3(epsilon,
                                    x.altValues(), x.altIndexMem(), ssvec.get_ptr(), sidx, n,
                                    y.get_ptr(), epsilon, rhs.altValues(), ridx, rsize,
                                    y2.get_ptr(), epsilon, rhs2.altValues(), ridx2, rsize2,
                                    forest.altValues(), &f, forest.altIndexMem());
      x.setSize(m);
      x.forceSetup();
      forest.setSize(f);
      forest.forceSetup();
   }

   rhs.forceSetup();
   rhs2.forceSetup();
   ssvec.setSize(0);
   ssvec.forceSetup();

   solveCount += 3;
   solveTime->stop();
}